

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

uint64_t __thiscall soul::Type::getPackedSizeInBytes(Type *this)

{
  Category CVar1;
  int iVar2;
  Structure *this_00;
  uint64_t uVar3;
  ulong uVar4;
  Type TStack_28;
  
  CVar1 = this->category;
  if (CVar1 == vector) {
    uVar3 = PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
    CVar1 = this->category;
    uVar4 = (ulong)CVar1;
    if (CVar1 != primitive) {
      if (CVar1 != vector) {
        throwInternalCompilerError("isVector()","getVectorSize",0xf7);
      }
      uVar4 = (ulong)this->boundingSize;
    }
    uVar3 = uVar4 * uVar3;
  }
  else if ((CVar1 != array) || (uVar3 = 8, this->boundingSize != 0)) {
    if (CVar1 == array) {
      getArrayElementType(&TStack_28,this);
      uVar3 = getPackedSizeInBytes(&TStack_28);
      if (this->category != array) {
        throwInternalCompilerError("isArray()","getArraySize",0x128);
      }
      iVar2 = this->boundingSize;
      RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
      uVar3 = uVar3 * (long)iVar2;
    }
    else {
      if (CVar1 != stringLiteral) {
        if (CVar1 != structure) {
          uVar3 = PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
          return uVar3;
        }
        this_00 = (this->structure).object;
        if (this_00 != (Structure *)0x0) {
          uVar3 = Structure::getPackedSizeInBytes(this_00);
          return uVar3;
        }
        throwInternalCompilerError("object != nullptr","operator->",0x47);
      }
      uVar3 = 4;
    }
  }
  return uVar3;
}

Assistant:

uint64_t Type::getPackedSizeInBytes() const
{
    if (isVector())         return primitiveType.getPackedSizeInBytes() * static_cast<uint64_t> (getVectorSize());
    if (isUnsizedArray())   return sizeof (void*);
    if (isArray())          return getArrayElementType().getPackedSizeInBytes() * static_cast<uint64_t> (getArraySize());
    if (isStruct())         return structure->getPackedSizeInBytes();
    if (isStringLiteral())  return sizeof (StringDictionary::Handle);

    return primitiveType.getPackedSizeInBytes();
}